

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O1

void __thiscall
embree::avx::BVHNBuilderTwoLevel<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>::RefBuilderSmall::
attachBuildRefs(RefBuilderSmall *this,
               BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  FastAllocator *this_00;
  long *plVar1;
  pointer *pppTVar2;
  atomic<int> *paVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  Geometry *pGVar7;
  BVH *pBVar8;
  MutexSys *this_01;
  iterator __position;
  Scene *pSVar9;
  long lVar10;
  BuildRef *pBVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  MutexSys *this_02;
  ulong uVar16;
  undefined8 *puVar17;
  ulong uVar18;
  ulong uVar19;
  PrimRef *pPVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  size_t size;
  ulong uVar24;
  Lock<embree::MutexSys> lock;
  vuint<4> v1;
  vuint<4> geomID;
  vuint<4> v2;
  PrimInfo pinfo;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *local_100;
  undefined1 local_f8 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  PrimRef *local_c0;
  undefined1 local_b8 [16];
  RefBuilderSmall *local_a8;
  long *local_a0;
  undefined1 local_98 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  undefined1 local_78 [16];
  long local_48;
  long local_40;
  
  pGVar7 = (topBuilder->scene->geometries).items[this->objectID_].ptr;
  uVar22 = pGVar7->numPrimitives;
  uVar24 = CONCAT44(0,uVar22);
  lVar21 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_e0._0_8_ = lVar21 + 0x550;
  if (lVar21 == 0) {
    local_e0._0_8_ = (MemoryMonitorInterface *)0x0;
  }
  local_e0[8] = false;
  local_d0 = (undefined1  [16])0x0;
  local_c0 = (PrimRef *)0x0;
  local_a8 = this;
  if (uVar24 != 0) {
    size = uVar24 << 5;
    (**((MemoryMonitorInterface *)local_e0._0_8_)->_vptr_MemoryMonitorInterface)
              (local_e0._0_8_,size,0);
    if (uVar22 < 0xe0000) {
      local_c0 = (PrimRef *)alignedMalloc(size,0x20);
    }
    else {
      local_c0 = (PrimRef *)os_malloc(size,(bool *)(local_e0 + 8));
    }
    local_d0._8_4_ = uVar22;
    local_d0._0_8_ = uVar24;
    local_d0._12_4_ = 0;
  }
  avx::createPrimRefArray
            ((PrimInfo *)&local_88.field_1,pGVar7,(uint)local_a8->objectID_,uVar24,
             (mvector<PrimRef> *)local_e0,
             &(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  if (local_40 != local_48) {
    local_a0 = (long *)__tls_get_addr(&PTR_02224d38);
    uVar24 = 0;
    local_100 = topBuilder;
    do {
      pBVar8 = local_100->bvh;
      this_02 = (MutexSys *)*local_a0;
      if (this_02 == (MutexSys *)0x0) {
        this_02 = (MutexSys *)alignedMalloc(0xc0,0x40);
        MutexSys::MutexSys(this_02);
        this_02[1].mutex = (void *)0x0;
        this_02[8].mutex = this_02;
        this_02[9].mutex = (void *)0x0;
        this_02[10].mutex = (void *)0x0;
        this_02[0xb].mutex = (void *)0x0;
        this_02[0xc].mutex = (void *)0x0;
        this_02[0xb].mutex = (void *)0x0;
        this_02[0xc].mutex = (void *)0x0;
        this_02[0xd].mutex = (void *)0x0;
        this_02[0xe].mutex = (void *)0x0;
        this_02[0x10].mutex = this_02;
        this_02[0x11].mutex = (void *)0x0;
        this_02[0x12].mutex = (void *)0x0;
        this_02[0x13].mutex = (void *)0x0;
        this_02[0x14].mutex = (void *)0x0;
        this_02[0x13].mutex = (void *)0x0;
        this_02[0x14].mutex = (void *)0x0;
        this_02[0x15].mutex = (void *)0x0;
        this_02[0x16].mutex = (void *)0x0;
        *local_a0 = (long)this_02;
        local_128[8] = 1;
        local_128._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        local_118._0_8_ = this_02;
        std::
        vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
        ::
        emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                  ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                    *)FastAllocator::s_thread_local_allocators,
                   (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                    *)local_118);
        if ((__uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
             )local_118._0_8_ !=
            (__uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
             )0x0) {
          std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                    ((default_delete<embree::FastAllocator::ThreadLocal2> *)local_118,
                     (ThreadLocal2 *)local_118._0_8_);
        }
        if (local_128[8] == '\x01') {
          MutexSys::unlock((MutexSys *)local_128._0_8_);
        }
      }
      this_00 = &pBVar8->alloc;
      uVar18 = (ulong)(((pBVar8->alloc).use_single_mode ^ 1) << 6);
      local_f8._0_8_ = 0x50;
      this_01 = *(MutexSys **)((long)&this_02[8].mutex + uVar18);
      if (this_00 != (FastAllocator *)this_01[1].mutex) {
        local_118[8] = 1;
        local_118._0_8_ = this_01;
        MutexSys::lock(this_01);
        if (this_01[1].mutex != (void *)0x0) {
          LOCK();
          plVar1 = (long *)((long)this_01[1].mutex + 0x118);
          *plVar1 = *plVar1 + (long)this_01[0x15].mutex + (long)this_01[0xd].mutex;
          UNLOCK();
          LOCK();
          plVar1 = (long *)((long)this_01[1].mutex + 0x120);
          *plVar1 = *plVar1 + (((long)this_01[0xb].mutex + (long)this_01[0x13].mutex) -
                              ((long)this_01[10].mutex + (long)this_01[0x12].mutex));
          UNLOCK();
          LOCK();
          plVar1 = (long *)((long)this_01[1].mutex + 0x128);
          *plVar1 = *plVar1 + (long)this_01[0x16].mutex + (long)this_01[0xe].mutex;
          UNLOCK();
        }
        this_01[0xb].mutex = (void *)0x0;
        this_01[0xc].mutex = (void *)0x0;
        this_01[0xd].mutex = (void *)0x0;
        this_01[0xe].mutex = (void *)0x0;
        this_01[9].mutex = (void *)0x0;
        this_01[10].mutex = (void *)0x0;
        this_01[0xb].mutex = (void *)0x0;
        this_01[0xc].mutex = (void *)0x0;
        this_01[0xc].mutex = (void *)(pBVar8->alloc).defaultBlockSize;
        this_01[0x11].mutex = (void *)0x0;
        this_01[0x12].mutex = (void *)0x0;
        this_01[0x13].mutex = (void *)0x0;
        this_01[0x14].mutex = (void *)0x0;
        this_01[0x13].mutex = (void *)0x0;
        this_01[0x14].mutex = (void *)0x0;
        this_01[0x15].mutex = (void *)0x0;
        this_01[0x16].mutex = (void *)0x0;
        this_01[0x14].mutex = (void *)(pBVar8->alloc).defaultBlockSize;
        LOCK();
        this_01[1].mutex = this_00;
        UNLOCK();
        local_b8._0_8_ = this_01;
        local_128[8] = 1;
        local_128._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        __position._M_current =
             (pBVar8->alloc).thread_local_allocators.
             super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pBVar8->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
          ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                    ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                      *)&(pBVar8->alloc).thread_local_allocators,__position,
                     (ThreadLocal2 **)local_b8);
        }
        else {
          *__position._M_current = (ThreadLocal2 *)local_b8._0_8_;
          pppTVar2 = &(pBVar8->alloc).thread_local_allocators.
                      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar2 = *pppTVar2 + 1;
        }
        if (local_128[8] == '\x01') {
          MutexSys::unlock((MutexSys *)local_128._0_8_);
        }
        if (local_118[8] == '\x01') {
          MutexSys::unlock((MutexSys *)local_118._0_8_);
        }
      }
      plVar1 = (long *)((long)&this_02[0xd].mutex + uVar18);
      *plVar1 = *plVar1 + local_f8._0_8_;
      lVar21 = *(long *)((long)&this_02[10].mutex + uVar18);
      uVar19 = (ulong)(-(int)lVar21 & 0xf);
      uVar16 = lVar21 + local_f8._0_8_ + uVar19;
      *(ulong *)((long)&this_02[10].mutex + uVar18) = uVar16;
      if (*(ulong *)((long)&this_02[0xb].mutex + uVar18) < uVar16) {
        *(long *)((long)&this_02[10].mutex + uVar18) = lVar21;
        uVar16 = *(ulong *)((long)&this_02[0xc].mutex + uVar18);
        if (uVar16 < (ulong)(local_f8._0_8_ << 2)) {
          puVar17 = (undefined8 *)FastAllocator::malloc(this_00,(size_t)local_f8);
        }
        else {
          local_128._0_8_ = uVar16;
          puVar17 = (undefined8 *)FastAllocator::malloc(this_00,(size_t)local_128);
          *(undefined8 **)((long)&this_02[9].mutex + uVar18) = puVar17;
          lVar21 = (*(long *)((long)&this_02[0xb].mutex + uVar18) -
                   *(long *)((long)&this_02[10].mutex + uVar18)) +
                   *(long *)((long)&this_02[0xe].mutex + uVar18);
          *(long *)((long)&this_02[0xe].mutex + uVar18) = lVar21;
          *(undefined8 *)((long)&this_02[10].mutex + uVar18) = 0;
          *(undefined8 *)((long)&this_02[0xb].mutex + uVar18) = local_128._0_8_;
          *(undefined8 *)((long)&this_02[10].mutex + uVar18) = local_f8._0_8_;
          if ((ulong)local_128._0_8_ < (ulong)local_f8._0_8_) {
            *(undefined8 *)((long)&this_02[10].mutex + uVar18) = 0;
            local_128._0_8_ = *(undefined8 *)((long)&this_02[0xc].mutex + uVar18);
            puVar17 = (undefined8 *)FastAllocator::malloc(this_00,(size_t)local_128);
            *(undefined8 **)((long)&this_02[9].mutex + uVar18) = puVar17;
            lVar21 = (*(long *)((long)&this_02[0xb].mutex + uVar18) -
                     *(long *)((long)&this_02[10].mutex + uVar18)) +
                     *(long *)((long)&this_02[0xe].mutex + uVar18);
            *(long *)((long)&this_02[0xe].mutex + uVar18) = lVar21;
            *(undefined8 *)((long)&this_02[10].mutex + uVar18) = 0;
            *(undefined8 *)((long)&this_02[0xb].mutex + uVar18) = local_128._0_8_;
            *(undefined8 *)((long)&this_02[10].mutex + uVar18) = local_f8._0_8_;
            if ((ulong)local_128._0_8_ < (ulong)local_f8._0_8_) {
              *(undefined8 *)((long)&this_02[10].mutex + uVar18) = 0;
              puVar17 = (undefined8 *)0x0;
              goto LAB_014f3555;
            }
          }
          *(long *)((long)&this_02[0xe].mutex + uVar18) = lVar21;
        }
      }
      else {
        plVar1 = (long *)((long)&this_02[0xe].mutex + uVar18);
        *plVar1 = *plVar1 + uVar19;
        puVar17 = (undefined8 *)
                  ((uVar16 - local_f8._0_8_) + *(long *)((long)&this_02[9].mutex + uVar18));
      }
LAB_014f3555:
      pSVar9 = local_100->bvh->scene;
      local_128 = (undefined1  [16])0x0;
      local_118 = (undefined1  [16])0x0;
      local_b8 = (undefined1  [16])0x0;
      local_f8 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      pPVar20 = local_c0 + uVar24;
      lVar21 = 0;
      local_98 = local_f8;
      do {
        if (uVar24 < (ulong)(local_40 - local_48)) {
          fVar5 = (pPVar20->lower).field_0.m128[3];
          *(float *)(local_f8 + lVar21) = fVar5;
          fVar6 = (pPVar20->upper).field_0.m128[3];
          *(float *)(local_98 + lVar21) = fVar6;
          pGVar7 = (pSVar9->geometries).items[(uint)fVar5].ptr;
          lVar10 = *(long *)&pGVar7->field_0x58;
          lVar23 = (ulong)(uint)fVar6 *
                   pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          uVar22 = *(uint *)&pGVar7[1].intersectionFilterN >> 2;
          *(uint *)(local_128 + lVar21) = *(int *)(lVar10 + lVar23) * uVar22;
          *(uint *)(local_118 + lVar21) = *(int *)(lVar10 + 4 + lVar23) * uVar22;
          *(uint *)(local_b8 + lVar21) = uVar22 * *(int *)(lVar10 + 8 + lVar23);
          uVar24 = uVar24 + 1;
        }
        else if (lVar21 != 0) {
          *(undefined4 *)(local_f8 + lVar21) = local_f8._0_4_;
          *(undefined4 *)(local_98 + lVar21) = 0xffffffff;
          uVar14 = local_128._0_4_;
          *(undefined4 *)(local_128 + lVar21) = local_128._0_4_;
          *(undefined4 *)(local_118 + lVar21) = uVar14;
          *(undefined4 *)(local_b8 + lVar21) = uVar14;
        }
        if (uVar24 < (ulong)(local_40 - local_48)) {
          pPVar20 = local_c0 + uVar24;
        }
        lVar21 = lVar21 + 4;
      } while (lVar21 != 0x10);
      *puVar17 = local_128._0_8_;
      puVar17[1] = local_128._8_8_;
      ((__uniq_ptr_data<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>,_true,_true>
        *)(puVar17 + 2))->
      super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
           = (__uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              )local_118._0_8_;
      puVar17[3] = local_118._8_8_;
      puVar17[4] = local_b8._0_8_;
      puVar17[5] = local_b8._8_8_;
      puVar17[6] = local_f8._0_8_;
      puVar17[7] = local_f8._8_8_;
      puVar17[8] = local_98._0_8_;
      puVar17[9] = local_98._8_8_;
      aVar12.m128 = (__m128)vinsertps_avx(local_88.m128,ZEXT416((uint)local_a8->objectID_),0x30);
      aVar13 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(local_78,ZEXT416(1),0x30);
      LOCK();
      paVar3 = &local_100->nextRef;
      iVar4 = (paVar3->super___atomic_base<int>)._M_i;
      (paVar3->super___atomic_base<int>)._M_i = (paVar3->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      pBVar11 = (local_100->refs).items;
      pBVar11[iVar4].super_PrimRef.upper.field_0 = aVar13;
      pBVar11[iVar4].super_PrimRef.lower.field_0 = aVar12;
      pBVar11[iVar4].node.ptr = (ulong)puVar17 | 9;
      pBVar11[iVar4].bounds_area = 0.0;
    } while (uVar24 < (ulong)(local_40 - local_48));
  }
  uVar15 = local_d0._8_8_;
  if (local_c0 != (PrimRef *)0x0) {
    if ((ulong)(local_d0._8_8_ << 5) < 0x1c00000) {
      alignedFree(local_c0);
    }
    else {
      os_free(local_c0,local_d0._8_8_ << 5,local_e0[8]);
    }
  }
  if (uVar15 != 0) {
    (***(_func_int ***)local_e0._0_8_)(local_e0._0_8_,uVar15 * -0x20,1);
  }
  return;
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }